

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::AnnotatedHandler::gatherForEncode
          (AnnotatedHandler *this,JsonCodec *codec,Reader *input,StringPtr prefix,
          StringPtr morePrefix,
          Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *flattenedFields)

{
  size_t *psVar1;
  Field field_00;
  Field field_01;
  Field field_02;
  StringPtr name;
  StringPtr prefix_00;
  StringPtr prefix_01;
  StringPtr name_00;
  StringPtr prefix_02;
  StringPtr name_01;
  StringPtr prefix_03;
  StringPtr prefix_04;
  ArrayDisposer *pAVar2;
  bool bVar3;
  Which WVar4;
  uint uVar5;
  size_t sVar6;
  Impl *pIVar7;
  NullableValue<capnp::StructSchema::Field> *other;
  Field *pFVar8;
  AnnotatedHandler *pAVar9;
  Iterator IVar10;
  Type TVar11;
  Reader local_8d8;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_890;
  char *local_848;
  size_t sStack_840;
  AnnotatedHandler *local_838;
  char *pcStack_830;
  FlattenedField local_828;
  undefined1 local_768 [8];
  Type type;
  Reader local_6f0;
  AnnotatedHandler *local_6a8;
  AnnotatedHandler *handler_1;
  AnnotatedHandler *_handler1276;
  Reader local_688;
  Type local_640;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_630;
  char *local_5e8;
  size_t sStack_5e0;
  AnnotatedHandler *local_5d8;
  char *pcStack_5d0;
  FlattenedField local_5c0;
  StringPtr *local_508;
  StringPtr *tag;
  StringPtr *_tag1271;
  FieldInfo *info_1;
  Field *which;
  undefined1 local_4a0 [8];
  NullableValue<capnp::StructSchema::Field> _which1269;
  Reader local_418;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_3d0;
  char *local_388;
  size_t sStack_380;
  AnnotatedHandler *local_378;
  char *pcStack_370;
  FlattenedField local_360;
  char *local_2a8;
  size_t sStack_2a0;
  AnnotatedHandler *local_298;
  char *pcStack_290;
  FieldInfo *local_288;
  Schema SStack_280;
  uint local_278;
  undefined4 uStack_274;
  SegmentReader *pSStack_270;
  CapTableReader *local_268;
  void *pvStack_260;
  WirePointer *local_258;
  StructDataBitCount SStack_250;
  StructPointerCount SStack_24c;
  undefined2 uStack_24a;
  Reader local_240;
  AnnotatedHandler *local_1f8;
  AnnotatedHandler *handler;
  AnnotatedHandler *_handler1261;
  Schema SStack_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  SegmentReader *pSStack_1d0;
  CapTableReader *local_1c8;
  void *pvStack_1c0;
  WirePointer *local_1b8;
  StructDataBitCount SStack_1b0;
  StructPointerCount SStack_1ac;
  undefined2 uStack_1aa;
  FieldInfo *local_1a0;
  FieldInfo *info;
  Field field;
  undefined1 local_148 [8];
  Iterator __end2;
  undefined1 local_128 [8];
  Iterator __begin2;
  FieldSubset *__range2;
  StructSchema schema;
  ReaderFor<capnp::DynamicStruct> reader;
  char *local_80;
  String local_68;
  undefined1 local_50 [8];
  String ownPrefix;
  Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *flattenedFields_local;
  Reader *input_local;
  JsonCodec *codec_local;
  AnnotatedHandler *this_local;
  StringPtr prefix_local;
  
  prefix_local.content.ptr = (char *)prefix.content.size_;
  pAVar9 = (AnnotatedHandler *)prefix.content.ptr;
  ownPrefix.content.disposer = (ArrayDisposer *)flattenedFields;
  this_local = pAVar9;
  kj::String::String((String *)local_50);
  sVar6 = kj::StringPtr::size(&morePrefix);
  if (sVar6 != 0) {
    sVar6 = kj::StringPtr::size((StringPtr *)&this_local);
    if (sVar6 == 0) {
      this_local = (AnnotatedHandler *)morePrefix.content.ptr;
      prefix_local.content.ptr = (char *)morePrefix.content.size_;
    }
    else {
      kj::str<kj::StringPtr&,kj::StringPtr&>
                (&local_68,(kj *)&this_local,&morePrefix,(StringPtr *)pAVar9);
      kj::String::operator=((String *)local_50,&local_68);
      kj::String::~String(&local_68);
      kj::StringPtr::StringPtr((StringPtr *)&reader.reader.nestingLimit,(String *)local_50);
      this_local = (AnnotatedHandler *)reader.reader._40_8_;
      prefix_local.content.ptr = local_80;
    }
  }
  DynamicValue::Reader::as<capnp::DynamicStruct>((ReaderFor<capnp::DynamicStruct> *)&schema,input);
  __range2 = (FieldSubset *)DynamicStruct::Reader::getSchema((Reader *)&schema);
  StructSchema::getNonUnionFields((FieldSubset *)&__begin2.index,(StructSchema *)&__range2);
  IVar10 = StructSchema::FieldSubset::begin((FieldSubset *)&__begin2.index);
  __end2._8_8_ = IVar10.container;
  __begin2.container._0_4_ = IVar10.index;
  local_128 = (undefined1  [8])__end2._8_8_;
  IVar10 = StructSchema::FieldSubset::end((FieldSubset *)&__begin2.index);
  field.proto._reader._40_8_ = IVar10.container;
  __end2.container._0_4_ = IVar10.index;
  local_148 = (undefined1  [8])field.proto._reader._40_8_;
  while (bVar3 = capnp::_::
                 IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                 ::operator==((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                               *)local_128,
                              (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                               *)local_148), ((bVar3 ^ 0xffU) & 1) != 0) {
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
    operator*((Field *)&info,
              (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
               *)local_128);
    uVar5 = StructSchema::Field::getIndex((Field *)&info);
    local_1a0 = kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::operator[]
                          (&this->fields,(ulong)uVar5);
    local_1b8 = field.proto._reader.pointers;
    SStack_1b0 = field.proto._reader.dataSize;
    SStack_1ac = field.proto._reader.pointerCount;
    uStack_1aa = field.proto._reader._38_2_;
    local_1c8 = field.proto._reader.capTable;
    pvStack_1c0 = field.proto._reader.data;
    local_1d8 = field.index;
    uStack_1d4 = field._12_4_;
    pSStack_1d0 = field.proto._reader.segment;
    _handler1261 = (AnnotatedHandler *)info;
    SStack_1e0 = field.parent.super_Schema.raw;
    pIVar7 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&codec->impl);
    field_00._8_8_ = SStack_1e0.raw;
    field_00.parent.super_Schema.raw = (Schema)(Schema)_handler1261;
    field_00.proto._reader.segment = (SegmentReader *)_local_1d8;
    field_00.proto._reader.capTable = (CapTableReader *)pSStack_1d0;
    field_00.proto._reader.data = local_1c8;
    field_00.proto._reader.pointers = (WirePointer *)pvStack_1c0;
    field_00.proto._reader._32_8_ = local_1b8;
    field_00.proto._reader.nestingLimit = SStack_1b0;
    field_00.proto._reader._44_2_ = SStack_1ac;
    field_00.proto._reader._46_2_ = uStack_1aa;
    bVar3 = DynamicStruct::Reader::has((Reader *)&schema,field_00,pIVar7->hasMode);
    if (bVar3) {
      pAVar9 = kj::_::readMaybe<capnp::JsonCodec::AnnotatedHandler_const>
                         (&local_1a0->flattenHandler);
      pAVar2 = ownPrefix.content.disposer;
      handler = pAVar9;
      if (pAVar9 == (AnnotatedHandler *)0x0) {
        local_378 = this_local;
        pcStack_370 = prefix_local.content.ptr;
        local_388 = (local_1a0->name).content.ptr;
        sStack_380 = (local_1a0->name).content.size_;
        kj::OneOf<capnp::StructSchema::Field,capnp::Type>::OneOf<capnp::StructSchema::Field&,int>
                  ((OneOf<capnp::StructSchema::Field,capnp::Type> *)&local_3d0,(Field *)&info);
        _which1269.field_1._56_8_ = info;
        field_02._8_8_ = field.parent.super_Schema.raw;
        field_02.parent.super_Schema.raw = (Schema)(Schema)info;
        field_02.proto._reader.segment = (SegmentReader *)field._8_8_;
        field_02.proto._reader.capTable = (CapTableReader *)field.proto._reader.segment;
        field_02.proto._reader.data = field.proto._reader.capTable;
        field_02.proto._reader.pointers = (WirePointer *)field.proto._reader.data;
        field_02.proto._reader._32_8_ = field.proto._reader.pointers;
        field_02.proto._reader.nestingLimit = field.proto._reader.dataSize;
        field_02.proto._reader._44_2_ = field.proto._reader.pointerCount;
        field_02.proto._reader._46_2_ = field.proto._reader._38_2_;
        DynamicStruct::Reader::get(&local_418,(Reader *)&schema,field_02);
        prefix_03.content.size_ = (size_t)pcStack_370;
        prefix_03.content.ptr = (char *)local_378;
        name_01.content.size_ = sStack_380;
        name_01.content.ptr = local_388;
        FlattenedField::FlattenedField(&local_360,prefix_03,name_01,&local_3d0,&local_418);
        kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
        add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                  ((Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)pAVar2,&local_360);
        FlattenedField::~FlattenedField(&local_360);
        DynamicValue::Reader::~Reader(&local_418);
        kj::OneOf<capnp::StructSchema::Field,_capnp::Type>::~OneOf(&local_3d0);
      }
      else {
        local_258 = field.proto._reader.pointers;
        SStack_250 = field.proto._reader.dataSize;
        SStack_24c = field.proto._reader.pointerCount;
        uStack_24a = field.proto._reader._38_2_;
        local_268 = field.proto._reader.capTable;
        pvStack_260 = field.proto._reader.data;
        local_278 = field.index;
        uStack_274 = field._12_4_;
        pSStack_270 = field.proto._reader.segment;
        local_288 = info;
        SStack_280 = field.parent.super_Schema.raw;
        field_01._8_8_ = field.parent.super_Schema.raw;
        field_01.parent.super_Schema.raw = (Schema)(Schema)info;
        field_01.proto._reader.segment = (SegmentReader *)field._8_8_;
        field_01.proto._reader.capTable = (CapTableReader *)field.proto._reader.segment;
        field_01.proto._reader.data = field.proto._reader.capTable;
        field_01.proto._reader.pointers = (WirePointer *)field.proto._reader.data;
        field_01.proto._reader._32_8_ = field.proto._reader.pointers;
        field_01.proto._reader.nestingLimit = field.proto._reader.dataSize;
        field_01.proto._reader._44_2_ = field.proto._reader.pointerCount;
        field_01.proto._reader._46_2_ = field.proto._reader._38_2_;
        local_1f8 = pAVar9;
        DynamicStruct::Reader::get(&local_240,(Reader *)&schema,field_01);
        local_298 = this_local;
        pcStack_290 = prefix_local.content.ptr;
        local_2a8 = (local_1a0->prefix).content.ptr;
        sStack_2a0 = (local_1a0->prefix).content.size_;
        prefix_04.content.size_ = (size_t)prefix_local.content.ptr;
        prefix_04.content.ptr = (char *)this_local;
        gatherForEncode(pAVar9,codec,&local_240,prefix_04,(StringPtr)(local_1a0->prefix).content,
                        (Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)
                        ownPrefix.content.disposer);
        DynamicValue::Reader::~Reader(&local_240);
      }
    }
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
    operator++((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                *)local_128);
  }
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&which,(Reader *)&schema);
  other = kj::_::readMaybe<capnp::StructSchema::Field>((Maybe<capnp::StructSchema::Field> *)&which);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_4a0,other);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe((Maybe<capnp::StructSchema::Field> *)&which);
  pFVar8 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_4a0);
  if (pFVar8 != (Field *)0x0) {
    info_1 = (FieldInfo *)
             kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                       ((NullableValue<capnp::StructSchema::Field> *)local_4a0);
    uVar5 = StructSchema::Field::getIndex((Field *)info_1);
    _tag1271 = &kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::operator[]
                          (&this->fields,(ulong)uVar5)->name;
    tag = kj::_::readMaybe<kj::StringPtr>(&this->unionTagName);
    pAVar2 = ownPrefix.content.disposer;
    if (tag != (StringPtr *)0x0) {
      local_5d8 = this_local;
      pcStack_5d0 = prefix_local.content.ptr;
      local_5e8 = (tag->content).ptr;
      sStack_5e0 = (tag->content).size_;
      local_508 = tag;
      capnp::Type::Type(&local_640,TEXT);
      kj::OneOf<capnp::StructSchema::Field,capnp::Type>::OneOf<capnp::Type,int>
                ((OneOf<capnp::StructSchema::Field,capnp::Type> *)&local_630,&local_640);
      Text::Reader::Reader((Reader *)&_handler1276,_tag1271 + 1);
      DynamicValue::Reader::Reader(&local_688,(Reader *)&_handler1276);
      prefix_02.content.size_ = (size_t)pcStack_5d0;
      prefix_02.content.ptr = (char *)local_5d8;
      name_00.content.size_ = sStack_5e0;
      name_00.content.ptr = local_5e8;
      FlattenedField::FlattenedField(&local_5c0,prefix_02,name_00,&local_630,&local_688);
      kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
      add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                ((Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)pAVar2,&local_5c0);
      FlattenedField::~FlattenedField(&local_5c0);
      DynamicValue::Reader::~Reader(&local_688);
      kj::OneOf<capnp::StructSchema::Field,_capnp::Type>::~OneOf(&local_630);
    }
    pAVar9 = kj::_::readMaybe<capnp::JsonCodec::AnnotatedHandler_const>
                       ((Maybe<const_capnp::JsonCodec::AnnotatedHandler_&> *)(_tag1271 + 2));
    handler_1 = pAVar9;
    if (pAVar9 == (AnnotatedHandler *)0x0) {
      TVar11 = StructSchema::Field::getType((Field *)info_1);
      type._0_8_ = TVar11.field_4;
      local_768 = TVar11._0_8_;
      WVar4 = capnp::Type::which((Type *)local_768);
      if ((WVar4 != VOID) ||
         (bVar3 = kj::Maybe<kj::StringPtr>::operator==(&this->unionTagName),
         ((bVar3 ^ 0xffU) & 1) == 0)) {
        pAVar2 = ownPrefix.content.disposer;
        local_838 = this_local;
        pcStack_830 = prefix_local.content.ptr;
        local_848 = (_tag1271->content).ptr;
        sStack_840 = (_tag1271->content).size_;
        kj::OneOf<capnp::StructSchema::Field,capnp::Type>::OneOf<capnp::StructSchema::Field&,int>
                  ((OneOf<capnp::StructSchema::Field,capnp::Type> *)&local_890,(Field *)info_1);
        DynamicStruct::Reader::get(&local_8d8,(Reader *)&schema,*(Field *)info_1);
        prefix_00.content.size_ = (size_t)pcStack_830;
        prefix_00.content.ptr = (char *)local_838;
        name.content.size_ = sStack_840;
        name.content.ptr = local_848;
        FlattenedField::FlattenedField(&local_828,prefix_00,name,&local_890,&local_8d8);
        kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
        add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                  ((Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)pAVar2,&local_828);
        FlattenedField::~FlattenedField(&local_828);
        DynamicValue::Reader::~Reader(&local_8d8);
        kj::OneOf<capnp::StructSchema::Field,_capnp::Type>::~OneOf(&local_890);
      }
    }
    else {
      local_6a8 = pAVar9;
      DynamicStruct::Reader::get(&local_6f0,(Reader *)&schema,*(Field *)info_1);
      psVar1 = &_tag1271[2].content.size_;
      type.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)*psVar1;
      prefix_01.content.size_ = (size_t)prefix_local.content.ptr;
      prefix_01.content.ptr = (char *)this_local;
      gatherForEncode(pAVar9,codec,&local_6f0,prefix_01,(StringPtr)*(ArrayPtr<const_char> *)psVar1,
                      (Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)
                      ownPrefix.content.disposer);
      DynamicValue::Reader::~Reader(&local_6f0);
    }
  }
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_4a0);
  kj::String::~String((String *)local_50);
  return;
}

Assistant:

void gatherForEncode(const JsonCodec& codec, DynamicValue::Reader input,
                       kj::StringPtr prefix, kj::StringPtr morePrefix,
                       kj::Vector<FlattenedField>& flattenedFields) const {
    kj::String ownPrefix;
    if (morePrefix.size() > 0) {
      if (prefix.size() > 0) {
        ownPrefix = kj::str(prefix, morePrefix);
        prefix = ownPrefix;
      } else {
        prefix = morePrefix;
      }
    }

    auto reader = input.as<DynamicStruct>();
    auto schema = reader.getSchema();
    for (auto field: schema.getNonUnionFields()) {
      auto& info = fields[field.getIndex()];
      if (!reader.has(field, codec.impl->hasMode)) {
        // skip
      } else KJ_IF_SOME(handler, info.flattenHandler) {
        handler.gatherForEncode(codec, reader.get(field), prefix, info.prefix, flattenedFields);
      } else {
        flattenedFields.add(FlattenedField {
            prefix, info.name, field, reader.get(field) });
      }
    }